

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void __thiscall
cashew::ValueBuilder::appendArgumentToFunction(ValueBuilder *this,Ref func,IString arg)

{
  bool bVar1;
  Ref *pRVar2;
  Value *this_00;
  Ref r;
  undefined1 local_20 [8];
  IString arg_local;
  Ref func_local;
  
  arg_local.str._M_len = arg.str._M_len;
  local_20 = (undefined1  [8])func.inst;
  arg_local.str._M_str = (char *)this;
  pRVar2 = Ref::operator[]((Ref *)&arg_local.str._M_str,0);
  bVar1 = Ref::operator==(pRVar2,(IString *)DEFUN);
  if (!bVar1) {
    __assert_fail("func[0] == DEFUN",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                  ,0x67d,"static void cashew::ValueBuilder::appendArgumentToFunction(Ref, IString)")
    ;
  }
  pRVar2 = Ref::operator[]((Ref *)&arg_local.str._M_str,2);
  this_00 = Ref::operator->(pRVar2);
  r = makeRawString((IString *)local_20);
  cashew::Value::push_back(this_00,r);
  return;
}

Assistant:

static void appendArgumentToFunction(Ref func, IString arg) {
    assert(func[0] == DEFUN);
    func[2]->push_back(makeRawString(arg));
  }